

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::GenerateGraphViz(cmake *this,char *fileName)

{
  cmGlobalGenerator *globalGenerator;
  string *psVar1;
  char *settingsFileName;
  char *fallbackSettingsFileName;
  string local_180 [8];
  string fallbackSettingsFile;
  string local_150 [8];
  string settingsFile;
  cmGraphVizWriter gvWriter;
  char *fileName_local;
  cmake *this_local;
  
  globalGenerator = GetGlobalGenerator(this);
  cmGraphVizWriter::cmGraphVizWriter
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),globalGenerator);
  psVar1 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::__cxx11::string::string(local_150,(string *)psVar1);
  std::__cxx11::string::operator+=(local_150,"/CMakeGraphVizOptions.cmake");
  psVar1 = GetHomeDirectory_abi_cxx11_(this);
  std::__cxx11::string::string(local_180,(string *)psVar1);
  std::__cxx11::string::operator+=(local_180,"/CMakeGraphVizOptions.cmake");
  settingsFileName = (char *)std::__cxx11::string::c_str();
  fallbackSettingsFileName = (char *)std::__cxx11::string::c_str();
  cmGraphVizWriter::ReadSettings
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),settingsFileName,
             fallbackSettingsFileName);
  cmGraphVizWriter::WritePerTargetFiles
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  cmGraphVizWriter::WriteTargetDependersFiles
            ((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  cmGraphVizWriter::WriteGlobalFile((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8),fileName);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_150);
  cmGraphVizWriter::~cmGraphVizWriter((cmGraphVizWriter *)((long)&settingsFile.field_2 + 8));
  return;
}

Assistant:

void cmake::GenerateGraphViz(const char* fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile.c_str(), fallbackSettingsFile.c_str());

  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}